

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  uint uVar1;
  container_t *c;
  _Bool _Var2;
  uint i_00;
  container_t *c_00;
  size_t i;
  size_t sVar3;
  uint16_t x;
  uint8_t typecode;
  ulong uVar4;
  uint8_t new_typecode;
  uint32_t *local_40;
  size_t local_38;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    i_00 = 0xffffffff;
    local_40 = vals;
    local_38 = n_args;
    for (sVar3 = 0; local_38 != sVar3; sVar3 = sVar3 + 1) {
      uVar1 = local_40[sVar3];
      x = (uint16_t)(uVar1 >> 0x10);
      if (((int)i_00 < 0) ||
         (uVar4 = (ulong)i_00, uVar1 >> 0x10 != (uint)(r->high_low_container).keys[uVar4])) {
        i_00 = ra_get_index(&r->high_low_container,x);
        if (-1 < (int)i_00) {
          uVar4 = (ulong)i_00;
          goto LAB_0010fec5;
        }
      }
      else {
LAB_0010fec5:
        c_00 = container_remove((r->high_low_container).containers[uVar4],(uint16_t)uVar1,
                                (r->high_low_container).typecodes[uVar4],&new_typecode);
        c = (r->high_low_container).containers[uVar4];
        typecode = new_typecode;
        if (c_00 != c) {
          container_free(c,(r->high_low_container).typecodes[uVar4]);
          typecode = new_typecode;
          ra_replace_key_and_container_at_index(&r->high_low_container,i_00,x,c_00,new_typecode);
        }
        _Var2 = container_nonzero_cardinality(c_00,typecode);
        if (!_Var2) {
          container_free(c_00,typecode);
          ra_remove_at_index(&r->high_low_container,i_00);
          i_00 = 0xffffffff;
        }
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos = -1; // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(r->high_low_container.containers[pos],
                                             vals[i] & 0xffff,
                                             r->high_low_container.typecodes[pos],
                                             &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}